

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,long w,long h,long d)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  runtime_error *this_00;
  ulong uVar6;
  void *pvVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int j;
  long k;
  long m;
  int local_44;
  long local_40;
  
  if (((*(long *)(in_RDI + 2) != in_RSI) || (*(long *)(in_RDI + 4) != in_RDX)) ||
     (*in_RDI != in_RCX)) {
    if (*(long *)(in_RDI + 6) < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    if ((*(long *)(in_RDI + 10) != 0) && (*(void **)(in_RDI + 10) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 10));
    }
    if ((*(long *)(in_RDI + 0xc) != 0) && (*(void **)(in_RDI + 0xc) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0xc));
    }
    *in_RDI = (int)in_RCX;
    *(long *)(in_RDI + 2) = in_RSI;
    *(long *)(in_RDI + 4) = in_RDX;
    *(long *)(in_RDI + 6) = *(long *)(in_RDI + 2) * *(long *)(in_RDI + 4) * (long)*in_RDI;
    in_RDI[8] = 0;
    in_RDI[9] = 0;
    in_RDI[10] = 0;
    in_RDI[0xb] = 0;
    in_RDI[0xc] = 0;
    in_RDI[0xd] = 0;
    if (0 < *(long *)(in_RDI + 6)) {
      lVar2 = *(long *)(in_RDI + 4);
      iVar1 = *in_RDI;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(in_RDI + 6);
      uVar6 = SUB168(auVar3 * ZEXT816(2),0);
      if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar6);
      *(void **)(in_RDI + 8) = pvVar7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = lVar2 * iVar1;
      uVar6 = SUB168(auVar4 * ZEXT816(8),0);
      if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar6);
      *(void **)(in_RDI + 10) = pvVar7;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)*in_RDI;
      uVar6 = SUB168(auVar5 * ZEXT816(8),0);
      if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar6);
      *(void **)(in_RDI + 0xc) = pvVar7;
      **(undefined8 **)(in_RDI + 10) = *(undefined8 *)(in_RDI + 8);
      for (local_40 = 1; local_40 < lVar2 * iVar1; local_40 = local_40 + 1) {
        *(long *)(*(long *)(in_RDI + 10) + local_40 * 8) =
             *(long *)(*(long *)(in_RDI + 10) + (local_40 + -1) * 8) + *(long *)(in_RDI + 2) * 2;
      }
      **(undefined8 **)(in_RDI + 0xc) = *(undefined8 *)(in_RDI + 10);
      for (local_44 = 1; local_44 < *in_RDI; local_44 = local_44 + 1) {
        *(long *)(*(long *)(in_RDI + 0xc) + (long)local_44 * 8) =
             *(long *)(*(long *)(in_RDI + 0xc) + (long)(local_44 + -1) * 8) +
             *(long *)(in_RDI + 4) * 8;
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }